

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O2

size_t test_orb_param(Mat *image_model,Mat *image_test,ORB_Param *val)

{
  bool bVar1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test;
  long lVar2;
  _InputArray *keypoint_model;
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  Ptr<cv::DescriptorMatcher> matcher;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  undefined4 local_118 [2];
  Mat *local_110;
  undefined8 local_108;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_100;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_88;
  
  keypoint_compute(&local_88,image_model,val);
  keypoint_compute(&local_100,image_test,val);
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(knn_matches.
                         super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  cv::DescriptorMatcher::create((MatcherType *)&matcher);
  filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_88.second;
  local_110 = &local_100.second;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108 = 0;
  filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_118[0] = 0x1010000;
  bVar1 = (bool)cv::noArray();
  keypoint_model = (_InputArray *)&filtered_matches;
  cv::DescriptorMatcher::knnMatch
            (_matcher,keypoint_model,(vector *)local_118,(int)&knn_matches,(_InputArray *)0x2,bVar1)
  ;
  filter_match(&filtered_matches,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)keypoint_model,keypoint_test,
               &knn_matches,0.75);
  lVar2 = (long)filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>._M_impl
                .super__Vector_impl_data._M_finish -
          CONCAT44(filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                   filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>.
                   _M_impl.super__Vector_impl_data._M_start._0_4_);
  std::_Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>::~_Vector_base
            (&filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>);
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector(&knn_matches);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair(&local_100);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair(&local_88);
  return lVar2 >> 4;
}

Assistant:

std::size_t test_orb_param(const cv::Mat& image_model, const cv::Mat& image_test, const ORB_Param& val)
{
    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, val);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, val);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);
    return filtered_matches.size();
}